

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O2

void __thiscall
HACD::MyAutoGeometry::addBone(MyAutoGeometry *this,HaU32 bone,HaU32 *bones,HaU32 *bcount)

{
  HaU32 *pHVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)*bcount;
  if (7 < uVar2) {
    __assert_fail("bcount < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/AutoGeometry.cpp"
                  ,0xda,
                  "void HACD::MyAutoGeometry::addBone(hacd::HaU32, hacd::HaU32 *, hacd::HaU32 &)");
  }
  uVar3 = 0;
  do {
    if (uVar2 == uVar3) {
      bones[uVar2] = bone;
      *bcount = *bcount + 1;
      return;
    }
    pHVar1 = bones + uVar3;
    uVar3 = uVar3 + 1;
  } while (*pHVar1 != bone);
  return;
}

Assistant:

void addBone(hacd::HaU32 bone,hacd::HaU32 *bones,hacd::HaU32 &bcount)
		{
			HACD_ASSERT(bcount < MAX_BONE_COUNT);
			if ( bcount < MAX_BONE_COUNT )
			{
				bool found = false;

				for (hacd::HaU32 i=0; i<bcount; i++)
				{
					if ( bones[i] == bone )
					{
						found = true;
						break;
					}
				}
				if ( !found )
				{
					bones[bcount] = bone;
					bcount++;
				}
			}
		}